

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O3

string * __thiscall
Test::Suite::toPrettyTypeName_abi_cxx11_(string *__return_storage_ptr__,Suite *this,type_info *type)

{
  size_type __len1;
  char *__ptr;
  size_t __len2;
  char *pcVar1;
  allocator<char> local_21;
  
  pcVar1 = (this->suiteName)._M_dataplus._M_p;
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1 + (*pcVar1 == '*'),&local_21)
  ;
  pcVar1 = (this->suiteName)._M_dataplus._M_p;
  __ptr = (char *)__cxa_demangle(pcVar1 + (*pcVar1 == '*'),0,0,0);
  pcVar1 = __ptr;
  if (__ptr == (char *)0x0) {
    pcVar1 = (this->suiteName)._M_dataplus._M_p;
    pcVar1 = pcVar1 + (*pcVar1 == '*');
  }
  __len1 = __return_storage_ptr__->_M_string_length;
  __len2 = strlen(pcVar1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (__return_storage_ptr__,0,__len1,pcVar1,__len2);
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Suite::toPrettyTypeName(const std::type_info &type) {
  // Adapted from Howard Hinnants's implementation in http://stackoverflow.com/a/18369732
  std::string result = type.name();
#if defined(__GNUG__) || defined(__clang__)
  std::unique_ptr<char, void (*)(void *)> owner{abi::__cxa_demangle(type.name(), nullptr, nullptr, nullptr), std::free};
  result = owner ? owner.get() : type.name();
#endif
  return result;
}